

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,true,false>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint uVar1;
  undefined4 left;
  undefined4 left_00;
  undefined4 left_01;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  timestamp_t tVar5;
  timestamp_t *ptVar6;
  timestamp_t *ptVar7;
  idx_t iVar8;
  ulong uVar9;
  int64_t *piVar10;
  idx_t iVar11;
  date_t lentry;
  ulong uVar12;
  ulong uVar13;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = ldata->days;
      piVar10 = &rdata->micros;
      iVar11 = 0;
      iVar8 = count;
      do {
        left_01 = ((interval_t *)(piVar10 + -1))->months;
        right_01.micros = iVar8;
        right_01._0_8_ = *piVar10;
        tVar5 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)uVar1,(date_t)left_01,right_01);
        result_data[iVar11].value = tVar5.value;
        iVar11 = iVar11 + 1;
        piVar10 = piVar10 + 2;
      } while (count != iVar11);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    ptVar6 = (timestamp_t *)0x0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar12 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar12 = count;
        }
LAB_0106bfbc:
        uVar4 = uVar9;
        if (uVar9 < uVar12) {
          uVar1 = ldata->days;
          piVar10 = &rdata[uVar9].micros;
          ptVar7 = ptVar6;
          do {
            left = ((interval_t *)(piVar10 + -1))->months;
            right.micros = (int64_t)ptVar7;
            right._0_8_ = *piVar10;
            tVar5 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                              ((AddOperator *)(ulong)uVar1,(date_t)left,right);
            result_data[uVar9].value = tVar5.value;
            uVar9 = uVar9 + 1;
            piVar10 = piVar10 + 2;
            uVar4 = uVar12;
          } while (uVar12 != uVar9);
        }
      }
      else {
        uVar3 = puVar2[(long)ptVar6];
        uVar12 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar12 = count;
        }
        uVar4 = uVar12;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_0106bfbc;
          uVar4 = uVar9;
          if (uVar9 < uVar12) {
            piVar10 = &rdata[uVar9].micros;
            uVar13 = 0;
            ptVar7 = ptVar6;
            do {
              if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                left_00 = ((interval_t *)(piVar10 + -1))->months;
                right_00.micros = (int64_t)ptVar7;
                right_00._0_8_ = *piVar10;
                tVar5 = AddOperator::
                        Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                  ((AddOperator *)(ulong)(uint)ldata->days,(date_t)left_00,right_00)
                ;
                (result_data + uVar9)[uVar13].value = tVar5.value;
                ptVar7 = result_data + uVar9;
              }
              uVar13 = uVar13 + 1;
              piVar10 = piVar10 + 2;
              uVar4 = uVar12;
            } while (uVar12 - uVar9 != uVar13);
          }
        }
      }
      uVar9 = uVar4;
      ptVar6 = (timestamp_t *)((long)&ptVar6->value + 1);
    } while (ptVar6 != (timestamp_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}